

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTokenTest::TearDown(BuildTokenTest *this)

{
  Test *pTVar1;
  size_type sVar2;
  BuildTokenTest *this_local;
  
  pTVar1 = g_current_test;
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                    (&(this->token_command_runner_).acquire_token_);
  testing::Test::Check
            (pTVar1,sVar2 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x1010,"0u == token_command_runner_.acquire_token_.size()");
  pTVar1 = g_current_test;
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                    (&(this->token_command_runner_).can_run_more_);
  testing::Test::Check
            (pTVar1,sVar2 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x1011,"0u == token_command_runner_.can_run_more_.size()");
  pTVar1 = g_current_test;
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                    (&(this->token_command_runner_).wait_for_command_);
  testing::Test::Check
            (pTVar1,sVar2 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x1012,"0u == token_command_runner_.wait_for_command_.size()");
  testing::Test::TearDown((Test *)this);
  return;
}

Assistant:

void BuildTokenTest::TearDown() {
  EXPECT_EQ(0u, token_command_runner_.acquire_token_.size());
  EXPECT_EQ(0u, token_command_runner_.can_run_more_.size());
  EXPECT_EQ(0u, token_command_runner_.wait_for_command_.size());

  BuildTest::TearDown();
}